

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall
Js::ScopeObjectChain::TryGetDebuggerScopePropertyInfo
          (ScopeObjectChain *this,PropertyId propertyId,RegSlot location,int offset,
          bool *isPropertyInDebuggerScope,bool *isConst,bool *isInDeadZone)

{
  int iVar1;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00
  ;
  DebuggerScope *this_01;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  int i;
  int index;
  undefined1 local_58 [8];
  DebuggerScopeProperty debuggerScopeProperty;
  
  if ((this->pScopeChain).ptr ==
      (List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1831,"(pScopeChain)","pScopeChain");
    if (!bVar3) goto LAB_006d306a;
    *puVar4 = 0;
  }
  if (isPropertyInDebuggerScope == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1832,"(isPropertyInDebuggerScope)","isPropertyInDebuggerScope");
    if (!bVar3) goto LAB_006d306a;
    *puVar4 = 0;
  }
  if (isConst == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1833,"(isConst)","isConst");
    if (!bVar3) {
LAB_006d306a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  index = 0;
  *isPropertyInDebuggerScope = false;
  *isConst = false;
  debuggerScopeProperty._8_8_ = isConst;
  do {
    this_00 = (this->pScopeChain).ptr;
    iVar1 = (this_00->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
            count;
    if (iVar1 <= index) {
LAB_006d3055:
      return index < iVar1;
    }
    pTVar5 = JsUtil::
             List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_00,index);
    this_01 = pTVar5->ptr;
    if (1 < this_01->scopeType - DiagParamScope) {
      bVar3 = DebuggerScope::TryGetProperty
                        (this_01,propertyId,location,(DebuggerScopeProperty *)local_58);
      if (bVar3) {
        bVar3 = DebuggerScope::IsOffsetInScope(this_01,offset);
        if (bVar3) {
          *isPropertyInDebuggerScope = true;
          if (isInDeadZone != (bool *)0x0) {
            bVar3 = DebuggerScopeProperty::IsInDeadZone((DebuggerScopeProperty *)local_58,offset);
            *isInDeadZone = bVar3;
          }
          *(byte *)debuggerScopeProperty._8_8_ = (byte)debuggerScopeProperty.location & 1;
          goto LAB_006d3055;
        }
        *isPropertyInDebuggerScope = this_01->scopeType != DiagBlockScopeInObject;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

bool ScopeObjectChain::TryGetDebuggerScopePropertyInfo(PropertyId propertyId, RegSlot location, int offset, bool* isPropertyInDebuggerScope, bool *isConst, bool* isInDeadZone)
    {
        Assert(pScopeChain);
        Assert(isPropertyInDebuggerScope);
        Assert(isConst);

        *isPropertyInDebuggerScope = false;
        *isConst = false;

        // Search through each block scope until we find the current scope.  If the register was found
        // in any of the scopes going down until we reach the scope of the debug break, then it's in scope.
        // if found but not in the scope, the out param will be updated (since it is actually a let or const), so that caller can make a call accordingly.
        for (int i = 0; i < pScopeChain->Count(); i++)
        {
            Js::DebuggerScope *debuggerScope = pScopeChain->Item(i);
            DebuggerScopeProperty debuggerScopeProperty;
            if (!debuggerScope->IsParamScope() && debuggerScope->TryGetProperty(propertyId, location, &debuggerScopeProperty))
            {
                bool isOffsetInScope = debuggerScope->IsOffsetInScope(offset);

                // For the Object scope, all the properties will have the same location (-1) so they can match. Use further check below to determine the propertyInDebuggerScope
                *isPropertyInDebuggerScope = isOffsetInScope || !debuggerScope->IsBlockObjectScope();

                if (isOffsetInScope)
                {
                    if (isInDeadZone != nullptr)
                    {
                        *isInDeadZone = debuggerScopeProperty.IsInDeadZone(offset);
                    }

                    *isConst = debuggerScopeProperty.IsConst();
                    return true;
                }
            }
        }

        return false;
    }